

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O1

qsizetype __thiscall
QStaticByteArrayMatcherBase::indexOfIn
          (QStaticByteArrayMatcherBase *this,char *needle,size_t nlen,char *haystack,qsizetype hlen,
          qsizetype from)

{
  bool bVar1;
  long lVar2;
  qsizetype qVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  byte *pbVar7;
  ulong uVar8;
  byte *pbVar9;
  char cVar10;
  long lVar11;
  byte *unaff_R13;
  
  lVar4 = 0;
  if (0 < from) {
    lVar4 = from;
  }
  if (nlen == 0) {
    qVar3 = -1;
    if (lVar4 <= hlen) {
      qVar3 = lVar4;
    }
    return qVar3;
  }
  pbVar9 = (byte *)(haystack + nlen + lVar4 + -1);
  pbVar7 = (byte *)(haystack + hlen);
  do {
    if (pbVar7 <= pbVar9) {
      return -1;
    }
    uVar5 = (ulong)(this->m_skiptable).data[*pbVar9];
    if (uVar5 == 0) {
      if ((long)nlen < 1) {
        lVar4 = 0;
      }
      else {
        bVar6 = *pbVar9;
        if (bVar6 == needle[nlen - 1]) {
          lVar11 = 0;
          do {
            lVar4 = -nlen;
            if (1 - nlen == lVar11) goto LAB_0030c760;
            bVar6 = pbVar9[lVar11 + -1];
            lVar4 = lVar11 + -1;
            lVar2 = lVar11 + (nlen - 2);
            lVar11 = lVar4;
          } while (bVar6 == needle[lVar2]);
          lVar11 = -lVar4;
          bVar1 = lVar11 < (long)nlen;
        }
        else {
          lVar11 = 0;
          lVar4 = 0;
          bVar1 = 0 < (long)nlen;
        }
        if (bVar1) {
          uVar5 = nlen - lVar11;
          if ((this->m_skiptable).data[bVar6] != nlen) {
            uVar5 = 1;
          }
          goto LAB_0030c6c7;
        }
      }
LAB_0030c760:
      unaff_R13 = pbVar9 + (lVar4 - (long)haystack) + 1;
      cVar10 = '\x01';
    }
    else {
LAB_0030c6c7:
      uVar8 = 0;
      if (pbVar9 <= pbVar7 + -uVar5) {
        uVar8 = uVar5;
      }
      bVar1 = pbVar7 + -uVar5 < pbVar9;
      pbVar9 = pbVar9 + uVar8;
      cVar10 = bVar1 * '\x03';
    }
    if (cVar10 != '\0') {
      pbVar7 = (byte *)0xffffffffffffffff;
      if (cVar10 != '\x03') {
        pbVar7 = unaff_R13;
      }
      return (qsizetype)pbVar7;
    }
  } while( true );
}

Assistant:

qsizetype QStaticByteArrayMatcherBase::indexOfIn(const char *needle, size_t nlen, const char *haystack, qsizetype hlen, qsizetype from) const noexcept
{
    if (from < 0)
        from = 0;
    return bm_find(reinterpret_cast<const uchar *>(haystack), hlen, from,
                   reinterpret_cast<const uchar *>(needle),   nlen, m_skiptable.data);
}